

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall
google::protobuf::DynamicMessageFactory::~DynamicMessageFactory(DynamicMessageFactory *this)

{
  Descriptor *type;
  TypeInfo *this_00;
  bool bVar1;
  unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>_>
  *puVar2;
  pointer ppVar3;
  uint *offsets;
  _Node_iterator_base<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_true>
  local_20;
  _Node_iterator_base<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_true>
  local_18;
  iterator iter;
  DynamicMessageFactory *this_local;
  
  (this->super_MessageFactory)._vptr_MessageFactory =
       (_func_int **)&PTR__DynamicMessageFactory_00d61af0;
  iter.
  super__Node_iterator_base<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_true>
             )(_Node_iterator_base<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_true>
               )this;
  puVar2 = (unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>_>
            *)internal::scoped_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap>::
              operator->(&this->prototypes_);
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>_>
       ::begin(puVar2);
  while( true ) {
    puVar2 = (unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>_>
              *)internal::scoped_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap>::
                operator->(&this->prototypes_);
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>_>
         ::end(puVar2);
    bVar1 = std::__detail::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_true>
                           *)&local_18);
    type = ppVar3->second->type;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_true>
                           *)&local_18);
    offsets = internal::scoped_array<unsigned_int>::get(&ppVar3->second->offsets);
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_true>
                           *)&local_18);
    DeleteDefaultOneofInstance(type,offsets,ppVar3->second->prototype);
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_true>
                           *)&local_18);
    this_00 = ppVar3->second;
    if (this_00 != (TypeInfo *)0x0) {
      DynamicMessage::TypeInfo::~TypeInfo(this_00);
      operator_delete(this_00,0x58);
    }
    std::__detail::
    _Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_false,_true>
                  *)&local_18);
  }
  internal::Mutex::~Mutex(&this->prototypes_mutex_);
  internal::scoped_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap>::~scoped_ptr
            (&this->prototypes_);
  MessageFactory::~MessageFactory(&this->super_MessageFactory);
  return;
}

Assistant:

DynamicMessageFactory::~DynamicMessageFactory() {
  for (PrototypeMap::Map::iterator iter = prototypes_->map_.begin();
       iter != prototypes_->map_.end(); ++iter) {
    DeleteDefaultOneofInstance(iter->second->type,
                               iter->second->offsets.get(),
                               iter->second->prototype);
    delete iter->second;
  }
}